

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.h
# Opt level: O2

void __thiscall CGL::Vertex::computeNormal(Vertex *this)

{
  double dVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  bool bVar12;
  _List_node_base *p_Var13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  (this->normal).field_0.field_0.z = 0.0;
  (this->normal).field_0.field_0.x = 0.0;
  (this->normal).field_0.field_0.y = 0.0;
  auVar5 = *(undefined1 (*) [16])(this->position).field_0.field_2.__vec;
  auVar7 = *(undefined1 (*) [16])(this->position).field_0.field_2.__vec;
  dVar1 = (this->position).field_0.field_0.z;
  p_Var13 = (this->_halfedge)._M_node;
  bVar12 = isBoundary(this);
  p_Var2 = (this->_halfedge)._M_node;
  dVar14 = (this->normal).field_0.field_0.x;
  dVar15 = (this->normal).field_0.field_0.y;
  dVar16 = (this->normal).field_0.field_0.z;
  if (bVar12) {
    do {
      p_Var3 = p_Var13[2]._M_next[2]._M_prev;
      p_Var4 = p_Var13[2]._M_next[2]._M_next[2]._M_prev;
      auVar8 = vsubpd_avx((undefined1  [16])p_Var3[2],auVar7);
      dVar10 = (double)p_Var3[3]._M_next - dVar1;
      auVar9 = vsubpd_avx((undefined1  [16])p_Var4[2],auVar7);
      dVar11 = (double)p_Var4[3]._M_next - dVar1;
      auVar5 = vshufpd_avx(auVar8,auVar8,1);
      auVar6 = vshufpd_avx(auVar9,auVar9,1);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = dVar10 * auVar9._0_8_ - dVar11 * auVar8._0_8_;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = auVar5._0_8_ * dVar11 - auVar6._0_8_ * dVar10;
      auVar18 = vunpcklpd_avx(auVar19,auVar17);
      dVar14 = dVar14 + auVar18._0_8_;
      dVar15 = dVar15 + auVar18._8_8_;
      dVar16 = dVar16 + (auVar8._0_8_ * auVar6._0_8_ - auVar9._0_8_ * auVar5._0_8_);
      (this->normal).field_0.field_0.x = dVar14;
      (this->normal).field_0.field_0.y = dVar15;
      (this->normal).field_0.field_0.z = dVar16;
      p_Var13 = p_Var13[2]._M_next[1]._M_prev;
    } while (p_Var13 != p_Var2);
  }
  else {
    do {
      p_Var3 = p_Var13[2]._M_next[2]._M_prev;
      p_Var4 = p_Var13[2]._M_next[2]._M_next[2]._M_prev;
      auVar8 = vsubpd_avx((undefined1  [16])p_Var3[2],auVar5);
      dVar10 = (double)p_Var3[3]._M_next - dVar1;
      auVar9 = vsubpd_avx((undefined1  [16])p_Var4[2],auVar5);
      dVar11 = (double)p_Var4[3]._M_next - dVar1;
      auVar7 = vshufpd_avx(auVar8,auVar8,1);
      auVar6 = vshufpd_avx(auVar9,auVar9,1);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = dVar10 * auVar9._0_8_ - dVar11 * auVar8._0_8_;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = auVar7._0_8_ * dVar11 - auVar6._0_8_ * dVar10;
      auVar18 = vunpcklpd_avx(auVar20,auVar18);
      dVar14 = dVar14 + auVar18._0_8_;
      dVar15 = dVar15 + auVar18._8_8_;
      dVar16 = dVar16 + (auVar8._0_8_ * auVar6._0_8_ - auVar9._0_8_ * auVar7._0_8_);
      (this->normal).field_0.field_0.x = dVar14;
      (this->normal).field_0.field_0.y = dVar15;
      (this->normal).field_0.field_0.z = dVar16;
      p_Var13 = p_Var13[1]._M_prev[2]._M_next;
    } while (p_Var13 != p_Var2);
  }
  Vector3D::normalize(&this->normal);
  return;
}

Assistant:

void computeNormal(void) {
    normal = Vector3D( 0., 0., 0. );
    Vector3D pi = position;

    // Iterate over neighbors.
    HalfedgeCIter h = halfedge();
    if (isBoundary()) {
      do {
         Vector3D pj = h->next()->vertex()->position;
         Vector3D pk = h->next()->next()->vertex()->position;
         normal += cross( pj-pi, pk-pi );
         h = h->next()->twin();
      } while( h != halfedge() );      
    } else {
      do {
         Vector3D pj = h->next()->vertex()->position;
         Vector3D pk = h->next()->next()->vertex()->position;
         normal += cross( pj-pi, pk-pi );
         h = h->twin()->next();
      } while( h != halfedge() );
    }

    normal.normalize();
  }